

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.hpp
# Opt level: O0

bool cppjieba::DecodeRunesInString(char *s,size_t len,Unicode *unicode)

{
  size_t sVar1;
  bool bVar2;
  size_t sVar3;
  RuneStr *t;
  size_t local_198;
  size_t i;
  undefined1 local_180 [8];
  RuneStrArray runes;
  Unicode *unicode_local;
  size_t len_local;
  char *s_local;
  
  runes.capacity_ = (size_t)unicode;
  limonp::LocalVector<unsigned_int>::clear(unicode);
  limonp::LocalVector<cppjieba::RuneStr>::LocalVector((LocalVector<cppjieba::RuneStr> *)local_180);
  bVar2 = DecodeRunesInString(s,len,(LocalVector<cppjieba::RuneStr> *)local_180);
  sVar1 = runes.capacity_;
  if (bVar2) {
    sVar3 = limonp::LocalVector<cppjieba::RuneStr>::size
                      ((LocalVector<cppjieba::RuneStr> *)local_180);
    limonp::LocalVector<unsigned_int>::reserve((LocalVector<unsigned_int> *)sVar1,sVar3);
    local_198 = 0;
    while( true ) {
      sVar3 = limonp::LocalVector<cppjieba::RuneStr>::size
                        ((LocalVector<cppjieba::RuneStr> *)local_180);
      sVar1 = runes.capacity_;
      if (sVar3 <= local_198) break;
      t = limonp::LocalVector<cppjieba::RuneStr>::operator[]
                    ((LocalVector<cppjieba::RuneStr> *)local_180,local_198);
      limonp::LocalVector<unsigned_int>::push_back((LocalVector<unsigned_int> *)sVar1,&t->rune);
      local_198 = local_198 + 1;
    }
    s_local._7_1_ = true;
  }
  else {
    s_local._7_1_ = false;
  }
  limonp::LocalVector<cppjieba::RuneStr>::~LocalVector((LocalVector<cppjieba::RuneStr> *)local_180);
  return s_local._7_1_;
}

Assistant:

inline bool DecodeRunesInString(const char* s, size_t len, Unicode& unicode) {
  unicode.clear();
  RuneStrArray runes;
  if (!DecodeRunesInString(s, len, runes)) {
    return false;
  }
  unicode.reserve(runes.size());
  for (size_t i = 0; i < runes.size(); i++) {
    unicode.push_back(runes[i].rune);
  }
  return true;
}